

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

void __thiscall
LowererMDArch::EmitLoadVar(LowererMDArch *this,Instr *instrLoad,bool isFromUint32,bool isHelper)

{
  LowererMD *pLVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Opnd *dstOpnd;
  RegOpnd *src;
  RegOpnd *pRVar6;
  Opnd *this_00;
  RegOpnd *dstOpnd_00;
  Instr *pIVar7;
  IntConstOpnd *newSrc;
  LabelInstr *branchTarget;
  LabelInstr *branchTarget_00;
  BranchInstr *pBVar8;
  
  bVar3 = IR::Opnd::IsRegOpnd(instrLoad->m_src1);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x9d2,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar3) goto LAB_005cfc72;
    *puVar5 = 0;
  }
  dstOpnd = instrLoad->m_dst;
  if (dstOpnd->m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x9d3,"(instrLoad->GetDst()->GetType() == TyVar)",
                       "instrLoad->GetDst()->GetType() == TyVar");
    if (!bVar3) goto LAB_005cfc72;
    *puVar5 = 0;
    dstOpnd = instrLoad->m_dst;
  }
  src = IR::Opnd::AsRegOpnd(instrLoad->m_src1);
  (src->super_Opnd).m_type = TyInt32;
  bVar3 = IR::Opnd::IsTaggedInt(&src->super_Opnd);
  if (!bVar3) {
    bVar4 = IR::Opnd::IsNotInt(&src->super_Opnd);
    if (bVar4) {
      pLVar1 = this->lowererMD;
      pRVar6 = IR::Opnd::AsRegOpnd(dstOpnd);
      LowererMD::EmitLoadVarNoCheck(pLVar1,pRVar6,src,instrLoad,isFromUint32,isHelper);
      return;
    }
  }
  pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
  this_00 = IR::Opnd::Copy(&pRVar6->super_Opnd,this->m_func);
  dstOpnd_00 = IR::Opnd::AsRegOpnd(this_00);
  (dstOpnd_00->super_Opnd).m_type = TyInt32;
  pIVar7 = IR::Instr::New(MOV_TRUNC,&dstOpnd_00->super_Opnd,&src->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrLoad,pIVar7);
  if (!bVar3 && isFromUint32) {
    pIVar7 = IR::Instr::New(CMP,this->m_func);
    IR::Instr::SetSrc1(pIVar7,&dstOpnd_00->super_Opnd);
    newSrc = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    IR::Instr::SetSrc2(pIVar7,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(instrLoad,pIVar7);
    branchTarget = IR::LabelInstr::New(Label,this->m_func,true);
    pBVar8 = IR::BranchInstr::New(JLT,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&pBVar8->super_Instr);
  }
  else {
    branchTarget = (LabelInstr *)0x0;
  }
  LowererMD::GenerateInt32ToVarConversion(this->lowererMD,&pRVar6->super_Opnd,instrLoad);
  pIVar7 = IR::Instr::New(MOV,dstOpnd,&pRVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrLoad,pIVar7);
  if (branchTarget != (LabelInstr *)0x0) {
    if (!isFromUint32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0xa12,"(isFromUint32)","isFromUint32");
      if (!bVar3) {
LAB_005cfc72:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    branchTarget_00 = IR::LabelInstr::New(Label,this->m_func,isHelper);
    pBVar8 = IR::BranchInstr::New(JMP,branchTarget_00,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&pBVar8->super_Instr);
    IR::Instr::InsertBefore(instrLoad,&branchTarget->super_Instr);
    pLVar1 = this->lowererMD;
    pRVar6 = IR::Opnd::AsRegOpnd(dstOpnd);
    LowererMD::EmitLoadVarNoCheck(pLVar1,pRVar6,src,instrLoad,isFromUint32,true);
    IR::Instr::InsertBefore(instrLoad,&branchTarget_00->super_Instr);
  }
  IR::Instr::Remove(instrLoad);
  return;
}

Assistant:

void
LowererMDArch::EmitLoadVar(IR::Instr *instrLoad, bool isFromUint32, bool isHelper)
{
    //    MOV_TRUNC e1, e_src1
    //    CMP e1, 0             [uint32]
    //    JLT $Helper           [uint32]  -- overflows?
    //    BTS r1, VarTag_Shift
    //    MOV r_dst, r1
    //    JMP $done             [uint32]
    // $helper                  [uint32]
    //    EmitLoadVarNoCheck
    // $done                    [uint32]


    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetDst()->GetType() == TyVar);

    bool isInt            = false;
    IR::Opnd *dst         = instrLoad->GetDst();
    IR::RegOpnd *src1     = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *labelHelper = nullptr;

    // TODO: Fix bad lowering. We shouldn't get TyVars here.
    // Assert(instrLoad->GetSrc1()->GetType() == TyInt32);
    src1->SetType(TyInt32);

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        // ToVar()
        this->lowererMD->EmitLoadVarNoCheck(dst->AsRegOpnd(), src1, instrLoad, isFromUint32, isHelper);
        return;
    }

    IR::RegOpnd *r1 = IR::RegOpnd::New(TyVar, m_func);

    // e1 = MOV_TRUNC e_src1
    // (Use MOV_TRUNC here as we rely on the register copy to clear the upper 32 bits.)
    IR::RegOpnd *e1 = r1->Copy(m_func)->AsRegOpnd();
    e1->SetType(TyInt32);
    instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC,
        e1,
        src1,
        m_func));

    if (!isInt && isFromUint32)
    {
        // CMP e1, 0
        IR::Instr *instr = IR::Instr::New(Js::OpCode::CMP, m_func);
        instr->SetSrc1(e1);
        instr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
        instrLoad->InsertBefore(instr);

        Assert(!labelHelper);
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);

        // JLT $helper
        instr = IR::BranchInstr::New(Js::OpCode::JLT, labelHelper, m_func);
        instrLoad->InsertBefore(instr);
    }

    // The previous operation clears the top 32 bits.
    // BTS r1, VarTag_Shift
    this->lowererMD->GenerateInt32ToVarConversion(r1, instrLoad);

    // REVIEW: We need r1 only if we could generate sn = Ld_A_I4 sn. i.e. the destination and
    // source are the same.
    // r_dst = MOV r1
    instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV,
        dst,
        r1,
        m_func));

    if (labelHelper)
    {
        Assert(isFromUint32);

        // JMP $done
        IR::LabelInstr * labelDone = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
        instrLoad->InsertBefore(IR::BranchInstr::New(Js::OpCode::JMP, labelDone, m_func));

        // $helper
        instrLoad->InsertBefore(labelHelper);

        // ToVar()
        this->lowererMD->EmitLoadVarNoCheck(dst->AsRegOpnd(), src1, instrLoad, isFromUint32, true);

        // $done
        instrLoad->InsertBefore(labelDone);
    }
    instrLoad->Remove();
}